

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O1

CURLcode ws_send_raw_blocking(CURL *data,websocket *ws,char *buffer,size_t buflen)

{
  curl_trc_feat *pcVar1;
  size_t sVar2;
  CURLcode CVar3;
  int iVar4;
  size_t in_RAX;
  timediff_t timeout_ms;
  char *fmt;
  size_t nwritten;
  size_t local_38;
  
  if (buffer == (char *)0x0) {
    return CURLE_OK;
  }
  local_38 = in_RAX;
  while( true ) {
    CVar3 = Curl_xfer_send(data,ws,(size_t)buffer,false,&local_38);
    sVar2 = local_38;
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    buffer = buffer + -local_38;
    if (buffer == (char *)0x0) {
      return CURLE_OK;
    }
    iVar4 = data->conn->sock[0];
    if ((((data != (CURL *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
        ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))))
       && (0 < Curl_trc_feat_ws.log_level)) {
      Curl_trc_ws(data,"ws_send_raw_blocking() partial, %zu left to send",buffer);
    }
    timeout_ms = Curl_timeleft(data,(curltime *)0x0,false);
    if (timeout_ms < 0) break;
    if (iVar4 == -1) {
      return CURLE_SEND_ERROR;
    }
    ws = (websocket *)((ws->dec).head + (sVar2 - 0x20));
    if (timeout_ms == 0) {
      timeout_ms = 500;
    }
    iVar4 = Curl_socket_check(-1,-1,iVar4,timeout_ms);
    if (iVar4 < 0) {
      fmt = "Error while waiting for socket becoming writable";
LAB_00168ed0:
      Curl_failf(data,fmt);
      return CURLE_SEND_ERROR;
    }
  }
  fmt = "Timeout waiting for socket becoming writable";
  goto LAB_00168ed0;
}

Assistant:

static CURLcode ws_send_raw_blocking(CURL *data, struct websocket *ws,
                                     const char *buffer, size_t buflen)
{
  CURLcode result = CURLE_OK;
  size_t nwritten;

  (void)ws;
  while(buflen) {
    result = Curl_xfer_send(data, buffer, buflen, FALSE, &nwritten);
    if(result)
      return result;
    DEBUGASSERT(nwritten <= buflen);
    buffer += nwritten;
    buflen -= nwritten;
    if(buflen) {
      curl_socket_t sock = data->conn->sock[FIRSTSOCKET];
      timediff_t left_ms;
      int ev;

      CURL_TRC_WS(data, "ws_send_raw_blocking() partial, %zu left to send",
                  buflen);
      left_ms = Curl_timeleft(data, NULL, FALSE);
      if(left_ms < 0) {
        failf(data, "Timeout waiting for socket becoming writable");
        return CURLE_SEND_ERROR;
      }

      /* POLLOUT socket */
      if(sock == CURL_SOCKET_BAD)
        return CURLE_SEND_ERROR;
      ev = Curl_socket_check(CURL_SOCKET_BAD, CURL_SOCKET_BAD, sock,
                             left_ms ? left_ms : 500);
      if(ev < 0) {
        failf(data, "Error while waiting for socket becoming writable");
        return CURLE_SEND_ERROR;
      }
    }
  }
  return result;
}